

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O2

bool __thiscall
spvtools::opt::Instruction::WhileEachInId(Instruction *this,function<bool_(unsigned_int_*)> *f)

{
  pointer pOVar1;
  uint **ppuVar2;
  bool bVar3;
  uint **ppuVar4;
  Operand *operand;
  pointer pOVar5;
  
  pOVar1 = (this->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pOVar5 = (this->operands_).
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_start; pOVar5 != pOVar1; pOVar5 = pOVar5 + 1) {
    bVar3 = spvIsInIdType(pOVar5->type);
    if (bVar3) {
      ppuVar2 = (uint **)(pOVar5->words).large_data_._M_t.
                         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                         ._M_head_impl;
      ppuVar4 = &(pOVar5->words).small_data_;
      if (ppuVar2 != (uint **)0x0) {
        ppuVar4 = ppuVar2;
      }
      bVar3 = std::function<bool_(unsigned_int_*)>::operator()(f,*ppuVar4);
      if (!bVar3) break;
    }
  }
  return pOVar5 == pOVar1;
}

Assistant:

inline bool Instruction::WhileEachInId(
    const std::function<bool(uint32_t*)>& f) {
  for (auto& operand : operands_) {
    if (spvIsInIdType(operand.type) && !f(&operand.words[0])) {
      return false;
    }
  }
  return true;
}